

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O0

UINT8 DecompressDataBlk_VGM
                (UINT32 *outLen,UINT8 **retOutData,UINT32 inLen,UINT8 *inData,
                PCM_COMPR_TBL *comprTbl)

{
  UINT8 *pUVar1;
  undefined1 local_58 [8];
  PCM_CDB_INF comprInf;
  UINT8 retVal;
  PCM_COMPR_TBL *comprTbl_local;
  UINT8 *inData_local;
  UINT32 inLen_local;
  UINT8 **retOutData_local;
  UINT32 *outLen_local;
  
  comprInf.cmprInfo.comprTbl._7_1_ = ReadComprDataBlkHdr(inLen,inData,(PCM_CDB_INF *)local_58);
  outLen_local._7_1_ = comprInf.cmprInfo.comprTbl._7_1_;
  if (comprInf.cmprInfo.comprTbl._7_1_ == '\0') {
    *outLen = local_58._4_4_;
    pUVar1 = (UINT8 *)realloc(*retOutData,(ulong)*outLen);
    *retOutData = pUVar1;
    comprInf.cmprInfo._0_8_ = comprTbl;
    outLen_local._7_1_ =
         DecompressDataBlk(*outLen,*retOutData,inLen - local_58._0_4_,inData + (uint)local_58._0_4_,
                           (PCM_CMP_INF *)&comprInf);
  }
  return outLen_local._7_1_;
}

Assistant:

UINT8 DecompressDataBlk_VGM(UINT32* outLen, UINT8** retOutData, UINT32 inLen, const UINT8* inData, const PCM_COMPR_TBL* comprTbl)
{
	UINT8 retVal;
	PCM_CDB_INF comprInf;
	
	retVal = ReadComprDataBlkHdr(inLen, inData, &comprInf);
	if (retVal)
		return retVal;
	
	*outLen = comprInf.decmpLen;
	*retOutData = (UINT8*)realloc(*retOutData, *outLen);
	comprInf.cmprInfo.comprTbl = comprTbl;
	
	return DecompressDataBlk(*outLen, *retOutData, inLen - comprInf.hdrSize, &inData[comprInf.hdrSize], &comprInf.cmprInfo);
}